

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O0

void __thiscall
notch::io::PlainTextNetworkReader::read_tag_value<std::__cxx11::string>
          (PlainTextNetworkReader *this,istream *in,string *tag,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val)

{
  runtime_error *this_00;
  bool bVar1;
  PlainTextNetworkReader local_b8 [4];
  undefined1 local_95;
  char local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  PlainTextNetworkReader local_48;
  string inTag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val_local;
  string *tag_local;
  istream *in_local;
  PlainTextNetworkReader *this_local;
  
  read_tag_abi_cxx11_(&local_48,(istream *)this);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_48,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tag);
  if (!bVar1) {
    read_value<std::__cxx11::string>
              (local_b8,(istream *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in);
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::string::~string((string *)&local_48);
    return;
  }
  local_95 = 1;
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          "tag \'");
  std::operator+(local_68,local_88);
  std::runtime_error::runtime_error(this_00,(string *)local_68);
  local_95 = 0;
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void read_tag_value(std::istream &in, std::string const &tag, VALUE &val) {
        std::string inTag = read_tag(in);
        if (inTag != tag) {
            throw std::runtime_error("tag '" + tag + "' not found");
        }
        read_value<VALUE>(in, val);
    }